

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSegmentParameter.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::LinearSegmentParameter::operator==
          (LinearSegmentParameter *this,LinearSegmentParameter *Value)

{
  KBOOL KVar1;
  LinearSegmentParameter *Value_local;
  LinearSegmentParameter *this_local;
  
  if (this->m_ui8SegNum == Value->m_ui8SegNum) {
    if ((this->m_ModificationUnion).m_ui8Modifications ==
        (Value->m_ModificationUnion).m_ui8Modifications) {
      KVar1 = LinearObjectAppearance::operator!=(&this->m_ObjApr,&Value->m_ObjApr);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else {
        KVar1 = WorldCoordinates::operator!=(&this->m_Loc,&Value->m_Loc);
        if (KVar1) {
          this_local._7_1_ = false;
        }
        else {
          KVar1 = EulerAngles::operator!=(&this->m_Ori,&Value->m_Ori);
          if (KVar1) {
            this_local._7_1_ = false;
          }
          else if (this->m_ui16Length == Value->m_ui16Length) {
            if (this->m_ui16Width == Value->m_ui16Width) {
              if (this->m_ui16Height == Value->m_ui16Height) {
                if (this->m_ui16Depth == Value->m_ui16Depth) {
                  this_local._7_1_ = true;
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL LinearSegmentParameter::operator == ( const LinearSegmentParameter & Value ) const
{
    if( m_ui8SegNum                            != Value.m_ui8SegNum )                            return false;
    if( m_ModificationUnion.m_ui8Modifications != Value.m_ModificationUnion.m_ui8Modifications ) return false;
    if( m_ObjApr                               != Value.m_ObjApr )                               return false;
    if( m_Loc                                  != Value.m_Loc )                                  return false;
    if( m_Ori                                  != Value.m_Ori )                                  return false;
    if( m_ui16Length                           != Value.m_ui16Length )                           return false;
    if( m_ui16Width                            != Value.m_ui16Width )                            return false;
    if( m_ui16Height                           != Value.m_ui16Height )                           return false;
    if( m_ui16Depth                            != Value.m_ui16Depth )                            return false;
    return true;
}